

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O0

void archive_entry_xattr_add_entry(archive_entry *entry,char *name,void *value,size_t size)

{
  undefined8 *puVar1;
  char *pcVar2;
  void *pvVar3;
  size_t in_RCX;
  void *in_RDX;
  char *in_RSI;
  long in_RDI;
  ae_xattr *xp;
  undefined8 *local_28;
  
  for (local_28 = *(undefined8 **)(in_RDI + 0x400); local_28 != (undefined8 *)0x0;
      local_28 = (undefined8 *)*local_28) {
  }
  puVar1 = (undefined8 *)malloc(0x20);
  if (puVar1 != (undefined8 *)0x0) {
    pcVar2 = strdup(in_RSI);
    puVar1[1] = pcVar2;
    pvVar3 = malloc(in_RCX);
    puVar1[2] = pvVar3;
    if (pvVar3 == (void *)0x0) {
      puVar1[3] = 0;
    }
    else {
      memcpy((void *)puVar1[2],in_RDX,in_RCX);
      puVar1[3] = in_RCX;
    }
    *puVar1 = *(undefined8 *)(in_RDI + 0x400);
    *(undefined8 **)(in_RDI + 0x400) = puVar1;
  }
  return;
}

Assistant:

void
archive_entry_xattr_add_entry(struct archive_entry *entry,
	const char *name, const void *value, size_t size)
{
	struct ae_xattr	*xp;

	for (xp = entry->xattr_head; xp != NULL; xp = xp->next)
		;

	if ((xp = (struct ae_xattr *)malloc(sizeof(struct ae_xattr))) == NULL)
		/* XXX Error XXX */
		return;

	xp->name = strdup(name);
	if ((xp->value = malloc(size)) != NULL) {
		memcpy(xp->value, value, size);
		xp->size = size;
	} else
		xp->size = 0;

	xp->next = entry->xattr_head;
	entry->xattr_head = xp;
}